

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall asmjit::v1_14::BaseEmitter::onSettingsUpdated(BaseEmitter *this)

{
  FormatFlags FVar1;
  CodeHolder *pCVar2;
  Logger *pLVar3;
  ushort uVar4;
  DiagnosticOptions DVar5;
  Error EVar6;
  ulong in_RCX;
  void *data;
  uint uVar7;
  long in_RSI;
  undefined1 *puVar8;
  ulong in_R8;
  size_t in_R9;
  ulong uVar9;
  char c;
  size_t size;
  size_t n;
  bool bVar10;
  char *unaff_retaddr;
  undefined8 uStack_2d8;
  ulong uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 *puStack_2c0;
  undefined1 auStack_2b8 [520];
  
  pCVar2 = this->_code;
  if (pCVar2 != (CodeHolder *)0x0) {
    if ((this->_emitterFlags & kOwnLogger) == kNone) {
      this->_logger = pCVar2->_logger;
    }
    if ((this->_emitterFlags & kOwnErrorHandler) == kNone) {
      this->_errorHandler = pCVar2->_errorHandler;
      BaseEmitter_updateForcedOptions(this);
      return;
    }
    if (this->_emitterType == kAssembler) {
      DVar5 = kValidateAssembler;
      if (this->_code == (CodeHolder *)0x0) {
        bVar10 = false;
      }
      else {
        bVar10 = this->_logger != (Logger *)0x0;
      }
    }
    else {
      bVar10 = this->_code != (CodeHolder *)0x0;
      DVar5 = kValidateIntermediate;
    }
    this->_emitterFlags = bVar10 << 3 | this->_emitterFlags & ~kLogComments;
    if (((this->_code != (CodeHolder *)0x0) && ((this->_diagnosticOptions & DVar5) == kNone)) &&
       (this->_logger == (Logger *)0x0)) {
      *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions & 0xfe;
      return;
    }
    *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions | kReserved;
    return;
  }
  onSettingsUpdated();
  if (in_RCX < in_R8) {
    EmitterUtils::finishFormattedLine();
    pLVar3 = this->_logger;
    puStack_2c0 = auStack_2b8;
    uStack_2d0 = 0;
    uStack_2d8 = 0x20;
    uStack_2c8 = 0x207;
    auStack_2b8[0] = 0;
    FVar1 = (pLVar3->_options)._flags;
    String::_opChars((String *)&uStack_2d8,kAppend,' ',
                     (ulong)(pLVar3->_options)._indentation._data[1]);
    Formatter::formatLabel
              ((String *)&uStack_2d8,(pLVar3->_options)._flags,this,*(uint32_t *)(in_RSI + 4));
    String::_opChar((String *)&uStack_2d8,kAppend,':');
    EmitterUtils::finishFormattedLine
              ((String *)&uStack_2d8,&pLVar3->_options,(uint8_t *)0x0,
               (ulong)(FVar1 & kMachineCode) - 1,0,0,this->_inlineComment);
    uVar9 = uStack_2d0;
    puVar8 = puStack_2c0;
    if ((uStack_2d8 & 0xff) < 0x1f) {
      uVar9 = uStack_2d8 & 0xff;
      puVar8 = (undefined1 *)((long)&uStack_2d8 + 1);
    }
    (*pLVar3->_vptr_Logger[2])(pLVar3,puVar8,uVar9);
    String::reset((String *)&uStack_2d8);
    return;
  }
  size = 0;
  if (unaff_retaddr != (char *)0x0) {
    do {
      if (unaff_retaddr[size] == '\0') goto LAB_0011e5bc;
      size = size + 1;
    } while (size != 0x400);
    size = 0x400;
  }
LAB_0011e5bc:
  if (in_RCX - 1 < 0xfffffffffffffffe || size != 0) {
    uVar7 = 0x2c;
    if ((short)*(uint *)(in_RSI + 8) != 0) {
      uVar7 = *(uint *)(in_RSI + 8);
    }
    n = (size_t)(uVar7 & 0xffff);
    uVar9 = (ulong)(in_RCX == 0xffffffffffffffff);
    c = ';';
    do {
      EVar6 = String::padEnd((String *)this,n,' ');
      if (((EVar6 != 0) || (EVar6 = String::_opChar((String *)this,kAppend,c), EVar6 != 0)) ||
         (EVar6 = String::_opChar((String *)this,kAppend,' '), EVar6 != 0)) {
LAB_0011e750:
        bVar10 = false;
        goto LAB_0011e753;
      }
      if (uVar9 == 0) {
        bVar10 = false;
        EVar6 = String::_opHex((String *)this,kAppend,data,in_RCX - (in_R8 + in_R9),'\0');
        if (EVar6 != 0) goto LAB_0011e753;
        EVar6 = String::_opChars((String *)this,kAppend,'.',in_R8 * 2);
        if (EVar6 != 0) goto LAB_0011e750;
        EVar6 = String::_opHex((String *)this,kAppend,(void *)((long)data + (in_RCX - in_R9)),in_R9,
                               '\0');
        if ((EVar6 != 0) || (size == 0)) {
          bVar10 = EVar6 == 0;
          goto LAB_0011e753;
        }
      }
      else {
        EVar6 = String::_opString((String *)this,kAppend,unaff_retaddr,size);
        if (EVar6 != 0) goto LAB_0011e750;
      }
      uVar4 = *(ushort *)(in_RSI + 10);
      if (*(ushort *)(in_RSI + 10) == 0) {
        uVar4 = 0x1a;
      }
      n = n + uVar4;
      uVar9 = uVar9 + 1;
      c = '|';
    } while (uVar9 == 1);
    bVar10 = true;
LAB_0011e753:
    if (!bVar10) {
      return;
    }
  }
  String::_opChar((String *)this,kAppend,'\n');
  return;
}

Assistant:

void BaseEmitter::onSettingsUpdated() noexcept {
  // Only called when attached to CodeHolder by CodeHolder.
  ASMJIT_ASSERT(_code != nullptr);

  if (!hasOwnLogger())
    _logger = _code->logger();

  if (!hasOwnErrorHandler())
    _errorHandler = _code->errorHandler();

  BaseEmitter_updateForcedOptions(this);
}